

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_builder_sah.cpp
# Opt level: O2

Builder * embree::sse2::BVH4VirtualMeshBuilderSAH
                    (void *bvh,UserGeometry *mesh,uint geomID,size_t mode)

{
  BVHNBuilderSAH<4,_embree::Object> *this;
  
  this = (BVHNBuilderSAH<4,_embree::Object> *)::operator_new(0xa8);
  BVHNBuilderSAH<4,_embree::Object>::BVHNBuilderSAH
            (this,(BVH *)bvh,(Geometry *)mesh,geomID,4,1.0,1,0xffffffffffffffff,MTY_USER_GEOMETRY);
  return &this->super_Builder;
}

Assistant:

Builder* BVH4VirtualMeshBuilderSAH    (void* bvh, UserGeometry* mesh, unsigned int geomID, size_t mode) {
      return new BVHNBuilderSAH<4,Object>((BVH4*)bvh,mesh,geomID,4,1.0f,1,inf,UserGeometry::geom_type);
    }